

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularEnum::GenerateAggregateInitializer
          (SingularEnum *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    io::Printer::Emit(p,0x3c,"\n        decltype(Impl_::Split::$name$_){$kDefault$},\n      ");
    return;
  }
  io::Printer::Emit(p,0x2f,"\n        decltype($field_$){$kDefault$},\n      ");
  return;
}

Assistant:

void GenerateAggregateInitializer(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        decltype(Impl_::Split::$name$_){$kDefault$},
      )cc");
    } else {
      p->Emit(R"cc(
        decltype($field_$){$kDefault$},
      )cc");
    }
  }